

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestJsonName::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestJsonName **v1;
  TestJsonName **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestJsonName *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestJsonName *from;
  TestJsonName *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestJsonName *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestJsonName *)to_msg;
  _this = (TestJsonName *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestJsonName_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestJsonName*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestJsonName_const*,proto2_unittest::TestJsonName*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar3;
    if ((uVar1 & 0x7f) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.field_name1_ = *(int32_t *)(absl_log_internal_check_op_result + 0x18)
        ;
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.fieldname2_ = *(int32_t *)(absl_log_internal_check_op_result + 0x1c);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.fieldname3_ = *(int32_t *)(absl_log_internal_check_op_result + 0x20);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_._field_name4_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x24);
      }
      if ((uVar1 & 0x10) != 0) {
        (from->field_0)._impl_.field_name5_ = *(int32_t *)(absl_log_internal_check_op_result + 0x28)
        ;
      }
      if ((uVar1 & 0x20) != 0) {
        (from->field_0)._impl_.field_name6_ = *(int32_t *)(absl_log_internal_check_op_result + 0x2c)
        ;
      }
      if ((uVar1 & 0x40) != 0) {
        (from->field_0)._impl_.fieldname7_ = *(int32_t *)(absl_log_internal_check_op_result + 0x30);
      }
    }
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
             ,0xb0f6,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void TestJsonName::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestJsonName*>(&to_msg);
  auto& from = static_cast<const TestJsonName&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestJsonName)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_name1_ = from._impl_.field_name1_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.fieldname2_ = from._impl_.fieldname2_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.fieldname3_ = from._impl_.fieldname3_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_._field_name4_ = from._impl_._field_name4_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.field_name5_ = from._impl_.field_name5_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.field_name6_ = from._impl_.field_name6_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.fieldname7_ = from._impl_.fieldname7_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}